

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testIO.cpp
# Opt level: O0

void testIO(string *tempDir)

{
  ostream *poVar1;
  char *__filename;
  string *unaff_retaddr;
  exception *e;
  string *in_stack_00000050;
  string *in_stack_00000080;
  char *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [56];
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Testing I/O based on image and file type");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator+(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  anon_unknown.dwarf_1ba98::testFlatScanLineImage1(unaff_retaddr);
  std::__cxx11::string::~string(local_38);
  std::operator+(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  anon_unknown.dwarf_1ba98::testFlatScanLineImage2(in_stack_00000080);
  std::__cxx11::string::~string(local_58);
  std::operator+(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  anon_unknown.dwarf_1ba98::testFlatTiledImage1(unaff_retaddr);
  std::__cxx11::string::~string(local_78);
  std::operator+(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  anon_unknown.dwarf_1ba98::testFlatTiledImage1(unaff_retaddr);
  std::__cxx11::string::~string(local_98);
  std::operator+(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  anon_unknown.dwarf_1ba98::testDeepScanLineImage1(unaff_retaddr);
  std::__cxx11::string::~string(local_b8);
  std::operator+(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  anon_unknown.dwarf_1ba98::testDeepScanLineImage2(in_stack_00000080);
  std::__cxx11::string::~string(local_d8);
  std::operator+(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  anon_unknown.dwarf_1ba98::testDeepTiledImage1(unaff_retaddr);
  std::__cxx11::string::~string(local_f8);
  std::operator+(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  anon_unknown.dwarf_1ba98::testDeepTiledImage2(in_stack_00000050);
  std::__cxx11::string::~string(local_118);
  poVar1 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator+(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  __filename = (char *)std::__cxx11::string::c_str();
  remove(__filename);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffec0);
  return;
}

Assistant:

void
testIO (const string& tempDir)
{
    try
    {
        cout << "Testing I/O based on image and file type" << endl;

        testFlatScanLineImage1 (tempDir + "io.exr");
        testFlatScanLineImage2 (tempDir + "io.exr");
        testFlatTiledImage1 (tempDir + "io.exr");
        testFlatTiledImage1 (tempDir + "io.exr");
        testDeepScanLineImage1 (tempDir + "io.exr");
        testDeepScanLineImage2 (tempDir + "io.exr");
        testDeepTiledImage1 (tempDir + "io.exr");
        testDeepTiledImage2 (tempDir + "io.exr");

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
    remove ((tempDir + "io.exr").c_str ());
}